

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O2

Builder * __thiscall
capnp::schema::Value::Builder::initStruct(Builder *__return_storage_ptr__,Builder *this)

{
  WirePointer *pWVar1;
  CapTableBuilder *pCVar2;
  
  *(undefined2 *)(this->_builder).data = 0x10;
  pWVar1 = (this->_builder).pointers;
  pCVar2 = (this->_builder).capTable;
  (__return_storage_ptr__->builder).segment = (this->_builder).segment;
  (__return_storage_ptr__->builder).capTable = pCVar2;
  (__return_storage_ptr__->builder).pointer = pWVar1;
  capnp::_::PointerBuilder::clear(&__return_storage_ptr__->builder);
  return __return_storage_ptr__;
}

Assistant:

inline ::capnp::AnyPointer::Builder Value::Builder::initStruct() {
  _builder.setDataField<Value::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Value::STRUCT);
  auto result = ::capnp::AnyPointer::Builder(_builder.getPointerField(
      ::capnp::bounded<0>() * ::capnp::POINTERS));
  result.clear();
  return result;
}